

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_keym_v1.cpp
# Opt level: O0

void __thiscall intel_keym_v1_t::_read(intel_keym_v1_t *this)

{
  uint8_t uVar1;
  structure_ids_t sVar2;
  validation_not_equal_error<intel_keym_v1_t::structure_ids_t> *this_00;
  kstream *pkVar3;
  validation_expr_error<unsigned_char> *this_01;
  km_hash_t *this_02;
  key_signature_t *this_03;
  unique_ptr<intel_keym_v1_t::key_signature_t,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
  local_90;
  unique_ptr<intel_keym_v1_t::km_hash_t,std::default_delete<intel_keym_v1_t::km_hash_t>>
  local_88 [14];
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  uint8_t local_54;
  byte local_53;
  undefined1 local_52;
  allocator<char> local_51;
  undefined1 local_50 [5];
  uint8_t _;
  structure_ids_t local_20 [2];
  intel_keym_v1_t *local_10;
  intel_keym_v1_t *this_local;
  
  local_10 = this;
  sVar2 = kaitai::kstream::read_u8le((this->super_kstruct).m__io);
  this->m_structure_id = sVar2;
  sVar2 = structure_id(this);
  if (sVar2 != STRUCTURE_IDS_KEYM) {
    local_52 = 1;
    this_00 = (validation_not_equal_error<intel_keym_v1_t::structure_ids_t> *)
              __cxa_allocate_exception(0x48);
    local_20[1] = 0x5f5f4d59454b5f5f;
    local_20[0] = structure_id(this);
    pkVar3 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"/seq/0",&local_51);
    kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>::validation_not_equal_error
              (this_00,local_20 + 1,local_20,pkVar3,(string *)local_50);
    local_52 = 0;
    __cxa_throw(this_00,&kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>::
                         typeinfo,
                kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>::
                ~validation_not_equal_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_version = uVar1;
  local_53 = version(this);
  if (0x1f < local_53) {
    local_7a = 1;
    this_01 = (validation_expr_error<unsigned_char> *)__cxa_allocate_exception(0x40);
    local_54 = version(this);
    pkVar3 = kaitai::kstruct::_io(&this->super_kstruct);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/seq/1",&local_79);
    kaitai::validation_expr_error<unsigned_char>::validation_expr_error
              (this_01,&local_54,pkVar3,&local_78);
    local_7a = 0;
    __cxa_throw(this_01,&kaitai::validation_expr_error<unsigned_char>::typeinfo,
                kaitai::validation_expr_error<unsigned_char>::~validation_expr_error);
  }
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_km_version = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_km_svn = uVar1;
  uVar1 = kaitai::kstream::read_u1((this->super_kstruct).m__io);
  this->m_km_id = uVar1;
  this_02 = (km_hash_t *)operator_new(0x48);
  km_hash_t::km_hash_t(this_02,(this->super_kstruct).m__io,this,this->m__root);
  std::unique_ptr<intel_keym_v1_t::km_hash_t,std::default_delete<intel_keym_v1_t::km_hash_t>>::
  unique_ptr<std::default_delete<intel_keym_v1_t::km_hash_t>,void>(local_88,this_02);
  std::unique_ptr<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>::
  operator=(&this->m_km_hash,
            (unique_ptr<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
             *)local_88);
  std::unique_ptr<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>::
  ~unique_ptr((unique_ptr<intel_keym_v1_t::km_hash_t,_std::default_delete<intel_keym_v1_t::km_hash_t>_>
               *)local_88);
  this_03 = (key_signature_t *)operator_new(0x40);
  key_signature_t::key_signature_t(this_03,(this->super_kstruct).m__io,this,this->m__root);
  std::
  unique_ptr<intel_keym_v1_t::key_signature_t,std::default_delete<intel_keym_v1_t::key_signature_t>>
  ::unique_ptr<std::default_delete<intel_keym_v1_t::key_signature_t>,void>
            ((unique_ptr<intel_keym_v1_t::key_signature_t,std::default_delete<intel_keym_v1_t::key_signature_t>>
              *)&local_90,this_03);
  std::
  unique_ptr<intel_keym_v1_t::key_signature_t,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
  ::operator=(&this->m_key_signature,&local_90);
  std::
  unique_ptr<intel_keym_v1_t::key_signature_t,_std::default_delete<intel_keym_v1_t::key_signature_t>_>
  ::~unique_ptr(&local_90);
  return;
}

Assistant:

void intel_keym_v1_t::_read() {
    m_structure_id = static_cast<intel_keym_v1_t::structure_ids_t>(m__io->read_u8le());
    if (!(structure_id() == intel_keym_v1_t::STRUCTURE_IDS_KEYM)) {
        throw kaitai::validation_not_equal_error<intel_keym_v1_t::structure_ids_t>(intel_keym_v1_t::STRUCTURE_IDS_KEYM, structure_id(), _io(), std::string("/seq/0"));
    }
    m_version = m__io->read_u1();
    {
        uint8_t _ = version();
        if (!(_ < 32)) {
            throw kaitai::validation_expr_error<uint8_t>(version(), _io(), std::string("/seq/1"));
        }
    }
    m_km_version = m__io->read_u1();
    m_km_svn = m__io->read_u1();
    m_km_id = m__io->read_u1();
    m_km_hash = std::unique_ptr<km_hash_t>(new km_hash_t(m__io, this, m__root));
    m_key_signature = std::unique_ptr<key_signature_t>(new key_signature_t(m__io, this, m__root));
}